

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O0

void __thiscall XmlOutput::addAttribute(XmlOutput *this,QString *attribute,QString *value)

{
  qsizetype qVar1;
  char *pcVar2;
  QTextStream *pQVar3;
  QString *in_RDI;
  long in_FS_OFFSET;
  QList<QString> *in_stack_ffffffffffffff28;
  QTextStream *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  QMessageLogger *in_stack_ffffffffffffff40;
  char *local_b8;
  bool local_a1;
  QString *text;
  XmlOutput *in_stack_ffffffffffffff78;
  undefined1 local_70 [72];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(uint *)((long)&in_RDI[2].d.ptr + 4) < 2) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(char *)in_stack_ffffffffffffff28);
    qVar1 = QList<QString>::size((QList<QString> *)(in_RDI + 3));
    if (qVar1 == 0) {
      local_b8 = "Root";
    }
    else {
      QList<QString>::last(in_stack_ffffffffffffff28);
      QString::toLatin1((QString *)in_stack_ffffffffffffff28);
      local_b8 = QByteArray::constData((QByteArray *)0x2c2694);
    }
    local_a1 = qVar1 != 0;
    QString::toLatin1((QString *)in_stack_ffffffffffffff28);
    pcVar2 = QByteArray::constData((QByteArray *)0x2c26d2);
    QMessageLogger::debug
              (local_28,"<%s>: Cannot add attribute (%s) since tag\'s not open",local_b8,pcVar2);
    QByteArray::~QByteArray((QByteArray *)0x2c26fd);
    if (local_a1) {
      QByteArray::~QByteArray((QByteArray *)0x2c2713);
    }
  }
  else {
    text = in_RDI;
    if ((int)in_RDI[2].d.size == 1) {
      ::operator<<(in_stack_ffffffffffffff30,(QTextStreamFunction)in_stack_ffffffffffffff28);
    }
    pQVar3 = (QTextStream *)
             QTextStream::operator<<((QTextStream *)(in_RDI->d).d,(QString *)&in_RDI[1].d.ptr);
    doConversion(in_stack_ffffffffffffff78,text);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)local_70);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"=\"");
    doConversion(in_stack_ffffffffffffff78,text);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&stack0xffffffffffffff78);
    QTextStream::operator<<(pQVar3,"\"");
    QString::~QString((QString *)0x2c27c2);
    QString::~QString((QString *)0x2c27cc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlOutput::addAttribute(const QString &attribute, const QString &value)
{
     switch(currentState) {
        case Bare:
        case Tag:
            //warn_msg(WarnLogic, "<%s>: Cannot add attribute since tags not open", tagStack.last().toLatin1().constData());
            qDebug("<%s>: Cannot add attribute (%s) since tag's not open",
                   (tagStack.size() ? tagStack.last().toLatin1().constData() : "Root"),
                   attribute.toLatin1().constData());
            return;
        case Attribute:
            break;
    }
    if (format == NewLine)
        xmlFile << Qt::endl;
    xmlFile << currentIndent << doConversion(attribute) << "=\"" << doConversion(value) << "\"";
}